

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  Index IVar1;
  FuncTypeModuleField *local_38;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_30;
  
  if (decl->has_func_type == false) {
    IVar1 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar1 == 0xffffffff) {
      MakeUnique<wabt::FuncTypeModuleField,wabt::Location_const&>((wabt *)&local_38,loc);
      FuncSignature::operator=(&(local_38->func_type).sig,&decl->sig);
      local_30._M_head_impl = local_38;
      local_38 = (FuncTypeModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                                  *)&local_30);
      if (local_30._M_head_impl != (FuncTypeModuleField *)0x0) {
        (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_30._M_head_impl = (FuncTypeModuleField *)0x0;
      if (local_38 != (FuncTypeModuleField *)0x0) {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<FuncTypeModuleField>(loc);
      func_type_field->func_type.sig = decl.sig;
      module->AppendField(std::move(func_type_field));
    }
  }
}